

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

bool __thiscall
r_exec::CTPX::build_mdl
          (CTPX *this,_Fact *f_icst,_Fact *cause_pattern,_Fact *consequent,
          GuardBuilder *guard_builder,uint64_t period)

{
  atomic_int_fast64_t *paVar1;
  _Object *p_Var2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  _TPX *bm;
  undefined4 extraout_var;
  Code *mdl;
  _TPX *this_00;
  uint16_t write_index;
  uint16_t local_32;
  
  local_32 = (uint16_t)((ulong)in_RAX >> 0x30);
  bm = (_TPX *)operator_new(0x38);
  BindingMap::BindingMap((BindingMap *)bm);
  LOCK();
  paVar1 = &(bm->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  p_Var2 = (this->super__TPX).super_TPX.target.object;
  iVar4 = (*p_Var2->_vptr__Object[9])(p_Var2,0);
  BindingMap::init((BindingMap *)bm,(EVP_PKEY_CTX *)CONCAT44(extraout_var,iVar4));
  BindingMap::init((BindingMap *)bm,(EVP_PKEY_CTX *)(this->super__TPX).super_TPX.target.object);
  this_00 = bm;
  BindingMap::init((BindingMap *)bm,(EVP_PKEY_CTX *)(this->super__TPX).super_TPX.target.object);
  mdl = _TPX::build_mdl_head(this_00,(HLPBindingMap *)bm,3,f_icst,consequent,&local_32);
  (*(guard_builder->super__Object)._vptr__Object[2])(guard_builder,mdl,0,cause_pattern,&local_32);
  _TPX::build_mdl_tail(&this->super__TPX,mdl,local_32);
  bVar3 = build_requirement(this,(HLPBindingMap *)bm,mdl,(uint64_t)cause_pattern);
  LOCK();
  paVar1 = &(bm->super_TPX).super__Object.refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if ((bm->super_TPX).super__Object.refCount.super___atomic_base<long>._M_i < 1) {
    (*(bm->super_TPX).super__Object._vptr__Object[1])(bm);
  }
  return bVar3;
}

Assistant:

bool CTPX::build_mdl(_Fact *f_icst, _Fact *cause_pattern, _Fact *consequent, GuardBuilder *guard_builder, uint64_t period)
{
    P<BindingMap> bm = new BindingMap();
    bm->init(target->get_reference(0), MK_VAL_VALUE);
    bm->init(target, FACT_AFTER);
    bm->init(target, FACT_BEFORE);
    uint16_t write_index;
    Code *m0 = build_mdl_head(bm, 3, f_icst, consequent, write_index);
    guard_builder->build(m0, nullptr, cause_pattern, write_index);
    build_mdl_tail(m0, write_index);
    return build_requirement(bm, m0, period); // existence checks performed there.
}